

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::detail::Dynamic_Object_Constructor::build_type_list
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,
          vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *tl)

{
  bool bVar1;
  allocator<chaiscript::Type_Info> local_39;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  local_38;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  local_30;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  local_28;
  const_iterator end;
  const_iterator begin;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *tl_local;
  
  end = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::begin(tl);
  local_28._M_current =
       (Type_Info *)
       std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::end(tl);
  bVar1 = __gnu_cxx::
          operator==<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
                    (&end,&local_28);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
    ::operator++(&end);
  }
  local_30._M_current = end._M_current;
  local_38._M_current = local_28._M_current;
  std::allocator<chaiscript::Type_Info>::allocator(&local_39);
  std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>::
  vector<__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>,void>
            ((vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>> *)
             __return_storage_ptr__,local_30,local_38,&local_39);
  std::allocator<chaiscript::Type_Info>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Type_Info> build_type_list(const std::vector<Type_Info> &tl) {
          auto begin = tl.begin();
          auto end = tl.end();

          if (begin != end) {
            ++begin;
          }

          return std::vector<Type_Info>(begin, end);
        }